

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O3

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  mz_bool mVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  mz_zip_internal_state *pmVar9;
  short *__ptr;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  mz_zip_archive *pZip_00;
  mz_zip_archive *pmVar16;
  short *psVar17;
  uint uVar18;
  long lVar19;
  mz_zip_internal_state *pmVar20;
  uint uVar21;
  mz_uint64 mVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  int local_1098;
  ulong local_1094;
  uint local_1088;
  uint local_1084;
  uint local_1080;
  int local_107c;
  uint local_1078;
  int local_1074;
  uint local_1070;
  int local_106c;
  mz_uint64 local_1068;
  int local_1058 [2];
  ulong local_1050;
  int local_1048;
  int local_1038;
  ushort local_1034;
  ushort local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar14 = pZip->m_archive_size;
  if (uVar14 < 0x16) {
LAB_00255fde:
    pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
  }
  else {
    mVar22 = 0;
    if (0x1000 < (long)uVar14) {
      mVar22 = uVar14 - 0x1000;
    }
    uVar11 = 0x1000;
    if (0x1000 < (long)uVar14) {
      uVar11 = uVar14;
    }
    lVar24 = 0x1000 - uVar11;
    lVar19 = 0x1014 - uVar11;
    do {
      uVar11 = uVar14 - mVar22;
      sVar8 = 0x1000;
      if (uVar11 < 0x1000) {
        sVar8 = uVar11;
      }
      sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar22,&local_1038,sVar8);
      if (sVar6 != sVar8) break;
      if (3 < uVar11) {
        uVar14 = uVar14 + lVar24;
        if (0xfff < uVar14) {
          uVar14 = 0x1000;
        }
        iVar12 = (int)uVar14;
        uVar14 = (ulong)(iVar12 - 4);
        lVar7 = lVar24 - (ulong)(iVar12 - 4);
        iVar12 = iVar12 + -3;
        do {
          if ((*(int *)((long)&local_1038 + uVar14) == 0x6054b50) &&
             (0x15 < pZip->m_archive_size + lVar7)) {
            sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar14 - lVar24,&local_1038,0x16);
            if (sVar8 == 0x16) {
              if (local_1038 != 0x6054b50) {
                pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
                return 0;
              }
              if (((0x4b < (long)(uVar14 - lVar24)) &&
                  (sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar14 - lVar19,local_1058,0x14),
                  sVar8 == 0x14)) && (local_1058[0] == 0x7064b50)) {
                if (pZip->m_archive_size - 0x38 < local_1050) goto LAB_00255fde;
                sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_1050,&local_1098,0x38);
                if ((sVar8 == 0x38) && (local_1098 == 0x6064b50)) {
                  pZip->m_pState->m_zip64 = 1;
                }
              }
              pZip->m_total_files = (uint)local_102e;
              pmVar20 = pZip->m_pState;
              if (pmVar20->m_zip64 == 0) {
                local_1080 = (uint)local_1030;
                local_1084 = (uint)local_1032;
                uVar14 = (ulong)local_1028;
                uVar21 = local_102c;
                local_1078 = (uint)local_102e;
                uVar23 = (uint)local_1034;
              }
              else {
                if (local_1094 < 0x2c) goto LAB_002561db;
                if (local_1048 != 1) goto LAB_00256640;
                if ((local_1074 != 0) || (pZip->m_total_files = local_1078, local_107c != 0)) {
                  pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
                  return 0;
                }
                uVar14 = local_1068;
                uVar21 = local_1070;
                uVar23 = local_1088;
                if (local_106c != 0) {
                  pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
                  return 0;
                }
              }
              if ((local_1078 != local_1080) ||
                 ((uVar23 != 0 || local_1084 != 0 && (local_1084 != 1 || uVar23 != 1))))
              goto LAB_00256640;
              if ((uVar21 < local_1078 * 0x2e) ||
                 (uVar11 = (ulong)uVar21, pZip->m_archive_size < uVar14 + uVar11))
              goto LAB_002561db;
              pZip->m_central_directory_file_ofs = uVar14;
              pZip_00 = (mz_zip_archive *)0x0;
              if (local_1078 == 0) goto LAB_00256608;
              pmVar9 = pmVar20;
              if ((pmVar20->m_central_dir).m_capacity < uVar11) {
                mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar20->m_central_dir,uVar11,0);
                if (mVar4 == 0) goto LAB_002563a9;
                pmVar9 = pZip->m_pState;
                local_1078 = pZip->m_total_files;
              }
              (pmVar20->m_central_dir).m_size = uVar11;
              uVar10 = (ulong)local_1078;
              pmVar20 = pmVar9;
              if ((pmVar9->m_central_dir_offsets).m_capacity < uVar10) {
                mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar9->m_central_dir_offsets,uVar10,0);
                if (mVar4 == 0) {
LAB_002563a9:
                  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                  return 0;
                }
                pmVar20 = pZip->m_pState;
              }
              (pmVar9->m_central_dir_offsets).m_size = uVar10;
              if ((flags >> 0xb & 1) == 0) {
                uVar10 = (ulong)pZip->m_total_files;
                pmVar9 = pmVar20;
                if ((pmVar20->m_sorted_central_dir_offsets).m_capacity < uVar10) {
                  mVar4 = mz_zip_array_ensure_capacity
                                    (pZip,&pmVar20->m_sorted_central_dir_offsets,uVar10,0);
                  if (mVar4 == 0) {
                    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    return 0;
                  }
                  pmVar9 = pZip->m_pState;
                }
                (pmVar20->m_sorted_central_dir_offsets).m_size = uVar10;
                pmVar20 = pmVar9;
              }
              sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar14,(pmVar20->m_central_dir).m_p,uVar11
                                      );
              if (sVar8 == uVar11) {
                pZip_00 = (mz_zip_archive *)0x0;
                if (pZip->m_total_files == 0) goto LAB_00256608;
                piVar15 = (int *)(pZip->m_pState->m_central_dir).m_p;
                pmVar16 = (mz_zip_archive *)0x0;
                goto LAB_002563fd;
              }
            }
            pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            return 0;
          }
          uVar14 = uVar14 - 1;
          lVar7 = lVar7 + 1;
          iVar13 = iVar12 + -1;
          bVar25 = 0 < iVar12;
          iVar12 = iVar13;
        } while (iVar13 != 0 && bVar25);
      }
      if (mVar22 == 0) {
        if (pZip == (mz_zip_archive *)0x0) {
          return 0;
        }
        break;
      }
      uVar14 = pZip->m_archive_size;
      uVar11 = uVar14 - mVar22;
      mVar22 = mVar22 - 0xffd;
      lVar24 = lVar24 + 0xffd;
      lVar19 = lVar19 + 0xffd;
    } while (uVar11 < 0x10015);
    pZip->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
  }
  return 0;
LAB_002563fd:
  if ((uVar21 < 0x2e) || (*piVar15 != 0x2014b50)) {
LAB_002561db:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  pmVar20 = pZip->m_pState;
  *(int *)((long)(pmVar20->m_central_dir_offsets).m_p + (long)pmVar16 * 4) =
       (int)piVar15 - *(int *)&(pmVar20->m_central_dir).m_p;
  if ((flags >> 0xb & 1) == 0) {
    *(int *)((long)(pmVar20->m_sorted_central_dir_offsets).m_p + (long)pmVar16 * 4) = (int)pmVar16;
  }
  uVar5 = piVar15[5];
  uVar3 = piVar15[6];
  if ((pmVar20->m_zip64_has_extended_info_fields == 0) &&
     (uVar1 = *(ushort *)((long)piVar15 + 0x1e), uVar1 != 0)) {
    uVar18 = uVar3;
    if (uVar3 < uVar5) {
      uVar18 = uVar5;
    }
    if (uVar18 <= *(uint *)((long)piVar15 + 0x2a)) {
      uVar18 = *(uint *)((long)piVar15 + 0x2a);
    }
    if (uVar18 == 0xffffffff) {
      uVar2 = *(ushort *)(piVar15 + 7);
      uVar11 = (ulong)uVar1;
      if (uVar21 < uVar2 + 0x2e + (uint)uVar1) {
        __ptr = (short *)malloc(uVar11);
        if (__ptr == (short *)0x0) {
          pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
          return 0;
        }
        sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,(ulong)uVar2 + uVar14 + 0x2e,__ptr,uVar11);
        psVar17 = __ptr;
        if (sVar8 != uVar11) {
          free(__ptr);
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          return 0;
        }
      }
      else {
        __ptr = (short *)0x0;
        psVar17 = (short *)((long)piVar15 + (ulong)uVar2 + 0x2e);
      }
      do {
        if ((uint)uVar11 < 4) {
LAB_00256653:
          free(__ptr);
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          return 0;
        }
        uVar10 = (ulong)(ushort)psVar17[1] + 4;
        if (uVar11 < uVar10) goto LAB_00256653;
        if (*psVar17 == 1) {
          pmVar20 = pZip->m_pState;
          pmVar20->m_zip64 = 1;
          pmVar20->m_zip64_has_extended_info_fields = 1;
          break;
        }
        uVar18 = ((uint)uVar11 - 4) - (uint)(ushort)psVar17[1];
        uVar11 = (ulong)uVar18;
        psVar17 = (short *)((long)psVar17 + uVar10);
      } while (uVar18 != 0);
      free(__ptr);
    }
  }
  if ((uVar3 != 0xffffffff && uVar5 != 0xffffffff) &&
     ((uVar3 != uVar5 && *(int *)((long)piVar15 + 10) == 0 || (uVar5 == 0 && uVar3 != 0))))
  goto LAB_002561db;
  uVar1 = *(ushort *)((long)piVar15 + 0x22);
  if ((uVar1 == 0xffff) || ((uVar1 != 1 && (uVar23 != uVar1)))) {
LAB_00256640:
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    return 0;
  }
  if ((uVar5 != 0xffffffff) &&
     (pZip->m_archive_size < (ulong)*(uint *)((long)piVar15 + 0x2a) + (ulong)uVar5 + 0x1e))
  goto LAB_002561db;
  if ((*(byte *)((long)piVar15 + 9) & 0x20) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  uVar5 = (uint)*(ushort *)(piVar15 + 8) +
          (uint)*(ushort *)((long)piVar15 + 0x1e) + (uint)*(ushort *)(piVar15 + 7) + 0x2e;
  bVar25 = uVar21 < uVar5;
  uVar21 = uVar21 - uVar5;
  if (bVar25) goto LAB_002561db;
  piVar15 = (int *)((long)piVar15 + (ulong)uVar5);
  pmVar16 = (mz_zip_archive *)((long)&pmVar16->m_archive_size + 1);
  pZip_00 = (mz_zip_archive *)(ulong)pZip->m_total_files;
  if (pZip_00 <= pmVar16) {
LAB_00256608:
    if ((flags >> 0xb & 1) == 0) {
      mz_zip_reader_sort_central_dir_offsets_by_filename(pZip_00);
      return 1;
    }
    return 1;
  }
  goto LAB_002563fd;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
					const mz_uint8 *pExtra_data;
					void* buf = NULL;

					if (MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + ext_data_size > n)
					{
						buf = MZ_MALLOC(ext_data_size);
						if(buf==NULL)
							return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

						if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size, buf, ext_data_size) != ext_data_size)
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
						}

						pExtra_data = (mz_uint8*)buf;
					}
					else
					{
						pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;
					}

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

						if (extra_size_remaining < (sizeof(mz_uint16) * 2))
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
						}

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

						if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
						{
							MZ_FREE(buf);
							return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
						}

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);

					MZ_FREE(buf);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}